

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_extended_result_codes(sqlite3 *db,int onoff)

{
  undefined4 uVar1;
  int in_ESI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14ec8f);
  uVar1 = 0xff;
  if (in_ESI != 0) {
    uVar1 = 0xffffffff;
  }
  *(undefined4 *)(in_RDI + 0x58) = uVar1;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14ecb9);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_extended_result_codes(sqlite3 *db, int onoff){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->errMask = onoff ? 0xffffffff : 0xff;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}